

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XTemplateSerializer.cpp
# Opt level: O0

void xercesc_4_0::XTemplateSerializer::storeObject
               (RefHashTableOf<xercesc_4_0::XSAnnotation,_xercesc_4_0::PtrHasher> *objToStore,
               XSerializeEngine *serEng)

{
  uint ui;
  bool bVar1;
  XMLSize_t XVar2;
  MemoryManager *pMVar3;
  uint *puVar4;
  void **ppvVar5;
  XSAnnotation *serObj;
  XSAnnotation *data;
  XMLSize_t XStack_c8;
  XSerializedObjectId_t keyId_1;
  XMLSize_t i;
  XMLSize_t itemNumber;
  void *pvStack_b0;
  XSerializedObjectId_t keyId;
  void *key;
  ValueVectorOf<void_*> keys;
  undefined1 local_70 [8];
  ValueVectorOf<unsigned_int> ids;
  RefHashTableOfEnumerator<xercesc_4_0::XSAnnotation,_xercesc_4_0::PtrHasher> e;
  XSerializeEngine *serEng_local;
  RefHashTableOf<xercesc_4_0::XSAnnotation,_xercesc_4_0::PtrHasher> *objToStore_local;
  
  bVar1 = XSerializeEngine::needToStoreObject(serEng,objToStore);
  if (bVar1) {
    XVar2 = RefHashTableOf<xercesc_4_0::XSAnnotation,_xercesc_4_0::PtrHasher>::getHashModulus
                      (objToStore);
    XSerializeEngine::writeSize(serEng,XVar2);
    pMVar3 = RefHashTableOf<xercesc_4_0::XSAnnotation,_xercesc_4_0::PtrHasher>::getMemoryManager
                       (objToStore);
    RefHashTableOfEnumerator<xercesc_4_0::XSAnnotation,_xercesc_4_0::PtrHasher>::
    RefHashTableOfEnumerator
              ((RefHashTableOfEnumerator<xercesc_4_0::XSAnnotation,_xercesc_4_0::PtrHasher> *)
               &ids.fMemoryManager,objToStore,false,pMVar3);
    pMVar3 = XSerializeEngine::getMemoryManager(serEng);
    ValueVectorOf<unsigned_int>::ValueVectorOf
              ((ValueVectorOf<unsigned_int> *)local_70,0x10,pMVar3,false);
    pMVar3 = XSerializeEngine::getMemoryManager(serEng);
    ValueVectorOf<void_*>::ValueVectorOf((ValueVectorOf<void_*> *)&key,0x10,pMVar3,false);
    while (bVar1 = RefHashTableOfEnumerator<xercesc_4_0::XSAnnotation,_xercesc_4_0::PtrHasher>::
                   hasMoreElements((RefHashTableOfEnumerator<xercesc_4_0::XSAnnotation,_xercesc_4_0::PtrHasher>
                                    *)&ids.fMemoryManager), bVar1) {
      pvStack_b0 = RefHashTableOfEnumerator<xercesc_4_0::XSAnnotation,_xercesc_4_0::PtrHasher>::
                   nextElementKey((RefHashTableOfEnumerator<xercesc_4_0::XSAnnotation,_xercesc_4_0::PtrHasher>
                                   *)&ids.fMemoryManager);
      itemNumber._4_4_ = XSerializeEngine::lookupStorePool(serEng,pvStack_b0);
      if (itemNumber._4_4_ != 0) {
        ValueVectorOf<unsigned_int>::addElement
                  ((ValueVectorOf<unsigned_int> *)local_70,(uint *)((long)&itemNumber + 4));
        ValueVectorOf<void_*>::addElement((ValueVectorOf<void_*> *)&key,&stack0xffffffffffffff50);
      }
    }
    XVar2 = ValueVectorOf<unsigned_int>::size((ValueVectorOf<unsigned_int> *)local_70);
    XSerializeEngine::writeSize(serEng,XVar2);
    for (XStack_c8 = 0; XStack_c8 < XVar2; XStack_c8 = XStack_c8 + 1) {
      puVar4 = ValueVectorOf<unsigned_int>::elementAt
                         ((ValueVectorOf<unsigned_int> *)local_70,XStack_c8);
      ui = *puVar4;
      ppvVar5 = ValueVectorOf<void_*>::elementAt((ValueVectorOf<void_*> *)&key,XStack_c8);
      serObj = RefHashTableOf<xercesc_4_0::XSAnnotation,_xercesc_4_0::PtrHasher>::get
                         (objToStore,*ppvVar5);
      XSerializeEngine::operator<<(serEng,ui);
      operator<<(serEng,&serObj->super_XSerializable);
    }
    ValueVectorOf<void_*>::~ValueVectorOf((ValueVectorOf<void_*> *)&key);
    ValueVectorOf<unsigned_int>::~ValueVectorOf((ValueVectorOf<unsigned_int> *)local_70);
    RefHashTableOfEnumerator<xercesc_4_0::XSAnnotation,_xercesc_4_0::PtrHasher>::
    ~RefHashTableOfEnumerator
              ((RefHashTableOfEnumerator<xercesc_4_0::XSAnnotation,_xercesc_4_0::PtrHasher> *)
               &ids.fMemoryManager);
  }
  return;
}

Assistant:

void XTemplateSerializer::storeObject(RefHashTableOf<XSAnnotation, PtrHasher>* const objToStore
                                    , XSerializeEngine&              serEng)
{
    if (serEng.needToStoreObject(objToStore))
    {
        serEng.writeSize (objToStore->getHashModulus());

        RefHashTableOfEnumerator<XSAnnotation, PtrHasher> e(objToStore, false, objToStore->getMemoryManager());

#ifdef XERCES_DEBUG_SORT_GRAMMAR
        //get the total item number
        unsigned int   itemNumber = 0;
        while (e.hasMoreElements())
        {
            void* key = e.nextElementKey();
            XSerializeEngine::XSerializedObjectId_t keyId = serEng.lookupStorePool(key);

            if (keyId)
                itemNumber++;
        }

        serEng.writeSize (itemNumber);
        e.Reset();

        //to sort the key
        //though keyId is not supposed to be involved in compare
        //we merely use the KeySet to encap both the string key and keyid
        SortArray sortArray(itemNumber, objToStore->getMemoryManager());
        while (e.hasMoreElements())
        {
            void* key = e.nextElementKey();
            XSerializeEngine::XSerializedObjectId_t keyId = serEng.lookupStorePool(key);

            if (keyId)
            {
                KeySet* keySet =
                    new (objToStore->getMemoryManager()) KeySet((XMLCh*)key, keyId, 0, objToStore->getMemoryManager());
                sortArray.addElement(keySet);
            }

        }

        sortArray.sort();

        //to store the data
        for (XMLSize_t i=0; i < itemNumber; i++)
        {
            GET_NEXT_KEYSET()

            XSerializeEngine::XSerializedObjectId_t keyId = (XSerializeEngine::XSerializedObjectId_t)intKey1;
            XSAnnotation* data = objToStore->get(strKey);

            serEng<<keyId;
            serEng<<data;
        }
#else
        ValueVectorOf<XSerializeEngine::XSerializedObjectId_t> ids(16, serEng.getMemoryManager());
        ValueVectorOf<void*> keys(16, serEng.getMemoryManager());

        while (e.hasMoreElements())
        {
            void* key = e.nextElementKey();
            XSerializeEngine::XSerializedObjectId_t keyId = serEng.lookupStorePool(key);

            if (keyId)
            {
                ids.addElement(keyId);
                keys.addElement(key);
            }
        }

        XMLSize_t itemNumber = ids.size();
        serEng.writeSize (itemNumber);

        for (XMLSize_t i=0; i<itemNumber; i++)
        {
            XSerializeEngine::XSerializedObjectId_t keyId = ids.elementAt(i);
            XSAnnotation* data = objToStore->get(keys.elementAt(i));
            serEng<<keyId;
            serEng<<data;
        }
#endif
    }
}